

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_test_registry.hpp
# Opt level: O2

void __thiscall
Catch::
TestInvokerAsMethod<(anonymous_namespace)::CATCH2_INTERNAL_TEMPLATE_TEST_135<std::pair<slang::SmallVector<(anonymous_namespace)::Constructable,_4UL>,_slang::SmallVector<(anonymous_namespace)::Constructable,_2UL>_>_>_>
::invoke(TestInvokerAsMethod<(anonymous_namespace)::CATCH2_INTERNAL_TEMPLATE_TEST_135<std::pair<slang::SmallVector<(anonymous_namespace)::Constructable,_4UL>,_slang::SmallVector<(anonymous_namespace)::Constructable,_2UL>_>_>_>
         *this)

{
  CATCH2_INTERNAL_TEMPLATE_TEST_135<std::pair<slang::SmallVector<(anonymous_namespace)::Constructable,_4UL>,_slang::SmallVector<(anonymous_namespace)::Constructable,_2UL>_>_>
  obj;
  DualSmallVectorsTest<std::pair<slang::SmallVector<(anonymous_namespace)::Constructable,_4UL>,_slang::SmallVector<(anonymous_namespace)::Constructable,_2UL>_>_>
  local_68;
  
  anon_unknown.dwarf_965823::Constructable::reset();
  local_68.theVector.super_SmallVectorBase<(anonymous_namespace)::Constructable>.data_ =
       (pointer)local_68.theVector.super_SmallVectorBase<(anonymous_namespace)::Constructable>.
                firstElement;
  local_68.theVector.super_SmallVectorBase<(anonymous_namespace)::Constructable>.len = 0;
  local_68.theVector.super_SmallVectorBase<(anonymous_namespace)::Constructable>.cap = 4;
  local_68.otherVector.super_SmallVectorBase<(anonymous_namespace)::Constructable>.data_ =
       (pointer)local_68.otherVector.super_SmallVectorBase<(anonymous_namespace)::Constructable>.
                firstElement;
  local_68.otherVector.super_SmallVectorBase<(anonymous_namespace)::Constructable>.len = 0;
  local_68.otherVector.super_SmallVectorBase<(anonymous_namespace)::Constructable>.cap = 2;
  (*(code *)this->m_testAsMethod)
            (local_68.theVector.super_SmallVectorBase<(anonymous_namespace)::Constructable>.
             firstElement + *(long *)&this->field_0x10 + -0x18);
  anon_unknown.dwarf_965823::
  DualSmallVectorsTest<std::pair<slang::SmallVector<(anonymous_namespace)::Constructable,_4UL>,_slang::SmallVector<(anonymous_namespace)::Constructable,_2UL>_>_>
  ::~DualSmallVectorsTest(&local_68);
  return;
}

Assistant:

void invoke() const override {
        C obj;
        (obj.*m_testAsMethod)();
    }